

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O1

void WebPDemuxDelete(WebPDemuxer *dmux)

{
  Frame *pFVar1;
  Chunk *pCVar2;
  Frame *ptr;
  Chunk *ptr_00;
  
  if (dmux == (WebPDemuxer *)0x0) {
    return;
  }
  ptr = dmux->frames_;
  while (ptr != (Frame *)0x0) {
    pFVar1 = ptr->next_;
    WebPSafeFree(ptr);
    ptr = pFVar1;
  }
  ptr_00 = dmux->chunks_;
  while (ptr_00 != (Chunk *)0x0) {
    pCVar2 = ptr_00->next_;
    WebPSafeFree(ptr_00);
    ptr_00 = pCVar2;
  }
  WebPSafeFree(dmux);
  return;
}

Assistant:

void WebPDemuxDelete(WebPDemuxer* dmux) {
  Chunk* c;
  Frame* f;
  if (dmux == NULL) return;

  for (f = dmux->frames_; f != NULL;) {
    Frame* const cur_frame = f;
    f = f->next_;
    WebPSafeFree(cur_frame);
  }
  for (c = dmux->chunks_; c != NULL;) {
    Chunk* const cur_chunk = c;
    c = c->next_;
    WebPSafeFree(cur_chunk);
  }
  WebPSafeFree(dmux);
}